

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeVertexArrayApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::draw_elements_base_vertex_primitive_mode_mismatch
               (NegativeTestContext *ctx)

{
  undefined *__s;
  deUint32 program_00;
  RenderContext *renderCtx;
  ProgramSources *pPVar1;
  allocator<char> local_241;
  string local_240;
  allocator<char> local_219;
  string local_218;
  ShaderSource local_1f8;
  ProgramSeparable local_1b9;
  ProgramSources local_1b8;
  undefined1 local_e8 [8];
  ShaderProgram program;
  GLfloat vertices [1];
  NegativeTestContext *ctx_local;
  
  renderCtx = NegativeTestContext::getRenderContext(ctx);
  glu::ProgramSources::ProgramSources(&local_1b8);
  glu::ProgramSeparable::ProgramSeparable(&local_1b9,true);
  pPVar1 = glu::ProgramSources::operator<<(&local_1b8,&local_1b9);
  __s = geometryShaderSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,__s,&local_219);
  glu::GeometrySource::GeometrySource((GeometrySource *)&local_1f8,&local_218);
  pPVar1 = glu::ProgramSources::operator<<(pPVar1,&local_1f8);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_e8,renderCtx,pPVar1);
  glu::GeometrySource::~GeometrySource((GeometrySource *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_218);
  std::allocator<char>::~allocator(&local_219);
  glu::ProgramSources::~ProgramSources(&local_1b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_240,
             "GL_INVALID_OPERATION is generated if a geometry shader is active and mode is incompatible with the input primitive type of the geometry shader in the currently installed program object."
             ,&local_241);
  NegativeTestContext::beginSection(ctx,&local_240);
  std::__cxx11::string::~string((string *)&local_240);
  std::allocator<char>::~allocator(&local_241);
  program_00 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e8);
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,program_00);
  glu::CallLogWrapper::glDrawElementsBaseVertex
            (&ctx->super_CallLogWrapper,4,1,0x1405,
             (void *)((long)&program.m_program.m_info.linkTimeUs + 4),1);
  NegativeTestContext::expectError(ctx,0x502);
  NegativeTestContext::endSection(ctx);
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,0);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_e8);
  return;
}

Assistant:

void draw_elements_base_vertex_primitive_mode_mismatch (NegativeTestContext& ctx)
{
	GLfloat				vertices[1];
	glu::ShaderProgram	program	(ctx.getRenderContext(), glu::ProgramSources() << glu::ProgramSeparable(true) << glu::GeometrySource(geometryShaderSource));

	ctx.beginSection("GL_INVALID_OPERATION is generated if a geometry shader is active and mode is incompatible with the input primitive type of the geometry shader in the currently installed program object.");
	ctx.glUseProgram(program.getProgram());
	ctx.glDrawElementsBaseVertex(GL_TRIANGLES, 1, GL_UNSIGNED_INT, vertices, 1);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.glUseProgram(0);
}